

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_fe_magnitude(secp256k1_fe *fe,int m)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int extraout_EDX;
  secp256k1_fe *psVar10;
  secp256k1_fe *psVar11;
  secp256k1_fe *psVar12;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  uint64_t uVar13;
  secp256k1_fe sStack_310;
  secp256k1_fe sStack_2e0;
  secp256k1_fe *psStack_2b0;
  secp256k1_fe sStack_288;
  secp256k1_fe sStack_258;
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  uint64_t uStack_210;
  secp256k1_fe *psStack_208;
  secp256k1_fe *psStack_200;
  code *pcStack_1f8;
  secp256k1_fe sStack_1f0;
  ushort auStack_1c0 [16];
  uint16_t auStack_1a0 [16];
  secp256k1_fe sStack_180;
  ushort auStack_140 [16];
  ushort auStack_120 [16];
  secp256k1_fe sStack_100;
  secp256k1_fe sStack_c0;
  secp256k1_fe sStack_90;
  secp256k1_fe *psStack_60;
  ulong uStack_58;
  code *pcStack_50;
  secp256k1_fe local_48;
  
  psVar11 = &local_48;
  pcStack_50 = (code *)0x14c94c;
  uVar5 = testrand_int(m + 1);
  pcStack_50 = (code *)0x14c957;
  secp256k1_fe_normalize(fe);
  if (uVar5 == 0) {
    return;
  }
  local_48.n[4]._0_4_ = 0;
  local_48.n[4]._4_4_ = 0;
  local_48.magnitude = 0;
  local_48.n[2] = 0;
  local_48.n[3]._0_4_ = 0;
  local_48.n[3]._4_4_ = 0;
  local_48.n[0] = 0;
  local_48.n[1] = 0;
  local_48.normalized = 1;
  pcStack_50 = (code *)0x14c984;
  secp256k1_fe_verify(&local_48);
  pcStack_50 = (code *)0x14c98c;
  secp256k1_fe_verify(&local_48);
  pcStack_50 = (code *)0x14c996;
  secp256k1_fe_verify_magnitude(&local_48,0);
  local_48.n[0] = 0x1ffffdfffff85e;
  local_48.n[1] = 0x1ffffffffffffe;
  local_48.n[2] = 0x1ffffffffffffe;
  local_48.n[3]._0_4_ = 0xfffffffe;
  local_48.n[3]._4_4_ = 0x1fffff;
  local_48.n[4]._0_4_ = 0xfffffffe;
  local_48.n[4]._4_4_ = 0x1ffff;
  local_48.magnitude = 1;
  local_48.normalized = 0;
  pcStack_50 = (code *)0x14c9d7;
  secp256k1_fe_verify(&local_48);
  psVar12 = (secp256k1_fe *)(ulong)(uVar5 - 1);
  pcStack_50 = (code *)0x14c9e3;
  secp256k1_fe_mul_int_unchecked(&local_48,uVar5 - 1);
  pcStack_50 = (code *)0x14c9eb;
  secp256k1_fe_verify(fe);
  pcStack_50 = (code *)0x14c9f3;
  secp256k1_fe_verify(&local_48);
  iVar6 = local_48.magnitude + fe->magnitude;
  if (iVar6 < 0x21) {
    uVar13 = fe->n[1];
    uVar3 = fe->n[2];
    uVar4 = fe->n[3];
    fe->n[0] = fe->n[0] + local_48.n[0];
    fe->n[1] = uVar13 + local_48.n[1];
    fe->n[2] = uVar3 + local_48.n[2];
    fe->n[3] = uVar4 + CONCAT44(local_48.n[3]._4_4_,(undefined4)local_48.n[3]);
    fe->n[4] = fe->n[4] + CONCAT44(local_48.n[4]._4_4_,(undefined4)local_48.n[4]);
    fe->magnitude = iVar6;
    fe->normalized = 0;
    pcStack_50 = (code *)0x14ca37;
    psVar11 = fe;
    secp256k1_fe_verify(fe);
    if (fe->magnitude == uVar5) {
      return;
    }
  }
  else {
    pcStack_50 = (code *)0x14ca4c;
    testutil_random_fe_magnitude_cold_2();
  }
  pcStack_50 = test_fe_mul;
  testutil_random_fe_magnitude_cold_1();
  pcStack_50 = (code *)&local_48;
  uStack_58 = (ulong)uVar5;
  psStack_60 = fe;
  sStack_1f0.n[0] = psVar11->n[0];
  sStack_1f0.n[1] = psVar11->n[1];
  sStack_1f0.n[2] = psVar11->n[2];
  sStack_1f0.n[3] = psVar11->n[3];
  sStack_1f0.n[4] = psVar11->n[4];
  sStack_1f0.magnitude = psVar11->magnitude;
  sStack_1f0.normalized = psVar11->normalized;
  if (extraout_EDX == 0) {
    pcStack_1f8 = (code *)0x14ca95;
    secp256k1_fe_mul(&sStack_1f0,&sStack_1f0,psVar12);
  }
  else {
    pcStack_1f8 = (code *)0x14ca8b;
    secp256k1_fe_sqr(&sStack_1f0,&sStack_1f0);
  }
  sStack_90.n[0] = psVar11->n[0];
  sStack_90.n[1] = psVar11->n[1];
  sStack_90.n[2] = psVar11->n[2];
  sStack_90.n[3] = psVar11->n[3];
  sStack_90.n[4] = psVar11->n[4];
  sStack_90.magnitude = psVar11->magnitude;
  sStack_90.normalized = psVar11->normalized;
  sStack_c0.n[0] = psVar12->n[0];
  sStack_c0.n[1] = psVar12->n[1];
  sStack_c0.n[2] = psVar12->n[2];
  sStack_c0.n[3] = psVar12->n[3];
  sStack_c0.n[4] = psVar12->n[4];
  sStack_c0.magnitude = psVar12->magnitude;
  sStack_c0.normalized = psVar12->normalized;
  pcStack_1f8 = (code *)0x14cae2;
  secp256k1_fe_normalize_var(&sStack_1f0);
  pcStack_1f8 = (code *)0x14caea;
  secp256k1_fe_normalize_var(&sStack_90);
  pcStack_1f8 = (code *)0x14caf2;
  secp256k1_fe_normalize_var(&sStack_c0);
  pcStack_1f8 = (code *)0x14cb02;
  secp256k1_fe_get_b32((uchar *)auStack_120,&sStack_90);
  pcStack_1f8 = (code *)0x14cb12;
  secp256k1_fe_get_b32((uchar *)auStack_140,&sStack_c0);
  pcStack_1f8 = (code *)0x14cb22;
  secp256k1_fe_get_b32((uchar *)(sStack_180.n + 4),&sStack_1f0);
  lVar8 = 0x10;
  lVar9 = 0;
  do {
    uVar1 = auStack_140[lVar8 + -1];
    *(ushort *)((long)sStack_180.n + lVar9) =
         auStack_120[lVar8 + -1] << 8 | auStack_120[lVar8 + -1] >> 8;
    uVar2 = *(ushort *)((long)sStack_180.n + lVar8 * 2 + 0x1e);
    *(ushort *)((long)auStack_1a0 + lVar9) = uVar1 << 8 | uVar1 >> 8;
    *(ushort *)((long)auStack_1c0 + lVar9) = uVar2 << 8 | uVar2 >> 8;
    lVar9 = lVar9 + 2;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  psVar12 = &sStack_100;
  psVar11 = &sStack_180;
  pcStack_1f8 = (code *)0x14cb83;
  mulmod256((uint16_t *)psVar12,(uint16_t *)psVar11,auStack_1a0,test_fe_mul::m16);
  lVar8 = 0;
  while (*(char *)((long)sStack_100.n + lVar8) == *(char *)((long)auStack_1c0 + lVar8)) {
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x20) {
      return;
    }
  }
  pcStack_1f8 = test_sqrt;
  test_fe_mul_cold_1();
  r_00 = &sStack_288;
  psVar10 = &sStack_288;
  r = &sStack_258;
  psStack_208 = &sStack_c0;
  psStack_200 = &sStack_90;
  pcStack_1f8 = (code *)&sStack_1f0;
  uVar7 = secp256k1_fe_sqrt(r,psVar12);
  if (uVar7 == (psVar11 == (secp256k1_fe *)0x0)) {
    test_sqrt_cold_6();
LAB_0014cd8a:
    test_sqrt_cold_5();
LAB_0014cd8f:
    test_sqrt_cold_4();
LAB_0014cd94:
    r_00 = r;
    psVar10 = psVar11;
    test_sqrt_cold_3();
  }
  else {
    if (psVar11 == (secp256k1_fe *)0x0) {
      return;
    }
    secp256k1_fe_verify(&sStack_258);
    psVar12 = (secp256k1_fe *)0x1;
    secp256k1_fe_verify_magnitude(&sStack_258,1);
    sStack_288.n[0] = 0x3ffffbfffff0bc - sStack_258.n[0];
    sStack_288.n[1] = 0x3ffffffffffffc - sStack_258.n[1];
    sStack_288.n[2] = 0x3ffffffffffffc - sStack_258.n[2];
    sStack_288.n[3] = 0x3ffffffffffffc - sStack_258.n[3];
    uVar13 = 0x3fffffffffffc - sStack_258.n[4];
    sStack_288.magnitude = 2;
    sStack_288.normalized = 0;
    sStack_288.n[4] = uVar13;
    uStack_228 = sStack_288.n[2];
    uStack_220 = sStack_288.n[3];
    uStack_218 = sStack_288.n[0];
    uStack_210 = sStack_288.n[1];
    secp256k1_fe_verify(&sStack_288);
    secp256k1_fe_verify(&sStack_258);
    r = psVar11;
    secp256k1_fe_verify(psVar11);
    iVar6 = psVar11->magnitude + sStack_258.magnitude;
    if (0x20 < iVar6) goto LAB_0014cd8a;
    sStack_258.n[0] = psVar11->n[0] + sStack_258.n[0];
    sStack_258.n[1] = psVar11->n[1] + sStack_258.n[1];
    sStack_258.n[2] = psVar11->n[2] + sStack_258.n[2];
    sStack_258.n[3] = psVar11->n[3] + sStack_258.n[3];
    sStack_258.n[4] = sStack_258.n[4] + psVar11->n[4];
    sStack_258.normalized = 0;
    sStack_258.magnitude = iVar6;
    secp256k1_fe_verify(&sStack_258);
    secp256k1_fe_verify(&sStack_288);
    r = psVar11;
    secp256k1_fe_verify(psVar11);
    if (0x1e < psVar11->magnitude) goto LAB_0014cd8f;
    sStack_288.n[0] = psVar11->n[0] + uStack_218;
    sStack_288.n[1] = psVar11->n[1] + uStack_210;
    sStack_288.n[2] = psVar11->n[2] + uStack_228;
    sStack_288.n[3] = psVar11->n[3] + uStack_220;
    sStack_288.n[4] = uVar13 + psVar11->n[4];
    sStack_288.normalized = 0;
    sStack_288.magnitude = psVar11->magnitude + 2;
    secp256k1_fe_verify(&sStack_288);
    secp256k1_fe_normalize(&sStack_258);
    secp256k1_fe_normalize(&sStack_288);
    r = &sStack_258;
    secp256k1_fe_verify(&sStack_258);
    psVar11 = &sStack_258;
    if (sStack_258.normalized == 0) goto LAB_0014cd94;
    if (((sStack_258.n[1] == 0 && sStack_258.n[3] == 0) &&
        (sStack_258.n[0] == 0 && sStack_258.n[2] == 0)) && sStack_258.n[4] == 0) {
      return;
    }
    secp256k1_fe_verify(&sStack_288);
    if (sStack_288.normalized != 0) {
      psVar10 = &sStack_288;
      if (((sStack_288.n[1] == 0 && sStack_288.n[3] == 0) &&
          (sStack_288.n[0] == 0 && sStack_288.n[2] == 0)) && sStack_288.n[4] == 0) {
        return;
      }
      goto LAB_0014cd9e;
    }
  }
  test_sqrt_cold_2();
LAB_0014cd9e:
  test_sqrt_cold_1();
  psVar11 = r_00 + 2;
  psStack_2b0 = psVar10;
  testutil_random_fe_non_zero_test(psVar11);
  secp256k1_fe_sqr(&sStack_2e0,psVar11);
  secp256k1_fe_mul(&sStack_310,&sStack_2e0,psVar11);
  secp256k1_fe_mul(r_00,psVar12,&sStack_2e0);
  secp256k1_fe_mul(r_00 + 1,psVar12 + 1,&sStack_310);
  *(int *)r_00[3].n = (int)psVar12[2].n[0];
  return;
}

Assistant:

static void testutil_random_fe_magnitude(secp256k1_fe *fe, int m) {
    secp256k1_fe zero;
    int n = testrand_int(m + 1);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_set_int(&zero, 0);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}